

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O3

void CreateBackwardReferencesNH5
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong *puVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ushort uVar6;
  uint32_t uVar7;
  size_t sVar8;
  size_t sVar9;
  uint16_t *puVar10;
  uint32_t *puVar11;
  BrotliEncoderDictionary *pBVar12;
  HasherCommon *pHVar13;
  BrotliDictionary *pBVar14;
  undefined8 uVar15;
  int iVar16;
  bool bVar17;
  ulong uVar18;
  size_t sVar19;
  uint uVar20;
  uint32_t uVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  byte bVar28;
  size_t sVar29;
  long lVar30;
  ulong uVar31;
  uint8_t *puVar32;
  ulong uVar33;
  ulong *puVar34;
  uint16_t uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  uint uVar42;
  long lVar43;
  uint8_t *puVar44;
  ulong uVar45;
  ulong uVar46;
  ulong *puVar47;
  int iVar48;
  ulong uVar49;
  uint8_t *puVar50;
  ulong uVar51;
  ulong uVar52;
  bool bVar53;
  uint8_t *puVar54;
  ulong uVar55;
  ulong local_178;
  ulong local_168;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_120;
  int local_114;
  ulong local_100;
  Command *local_e8;
  size_t local_d0;
  uint local_c8;
  int local_c4;
  ulong local_b0;
  uint8_t *s1_orig_4;
  ulong local_70;
  uint8_t *s1_orig_1;
  uint16_t *num;
  
  iVar23 = params->lgwin;
  uVar4 = (position - 3) + num_bytes;
  sVar29 = position;
  if (3 < num_bytes) {
    sVar29 = uVar4;
  }
  sVar8 = params->stream_offset;
  lVar30 = 0x200;
  if (params->quality < 9) {
    lVar30 = 0x40;
  }
  local_d0 = *last_insert_len;
  uVar1 = position + num_bytes;
  sVar9 = (params->dictionary).compound.total_size;
  uVar20 = *(uint *)((long)&(hasher->privat)._H35.hb.table + 4);
  if (4 < (int)uVar20) {
    iVar48 = *dist_cache;
    dist_cache[4] = iVar48 + -1;
    dist_cache[5] = iVar48 + 1;
    dist_cache[6] = iVar48 + -2;
    dist_cache[7] = iVar48 + 2;
    *(ulong *)(dist_cache + 8) = CONCAT44(iVar48 + 3,iVar48 + -3);
    if (10 < uVar20) {
      iVar48 = dist_cache[1];
      dist_cache[10] = iVar48 + -1;
      dist_cache[0xb] = iVar48 + 1;
      dist_cache[0xc] = iVar48 + -2;
      dist_cache[0xd] = iVar48 + 2;
      *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar48 + 3,iVar48 + -3);
    }
  }
  if (position + 4 < uVar1) {
    uVar5 = (1L << ((byte)iVar23 & 0x3f)) - 0x10;
    local_138 = lVar30 + position;
    puVar10 = (hasher->privat)._H5.num_;
    puVar11 = (hasher->privat)._H5.buckets_;
    lVar24 = sVar9 + 1;
    local_e8 = commands;
    uVar45 = position;
    do {
      uVar52 = uVar5;
      if (uVar45 < uVar5) {
        uVar52 = uVar45;
      }
      uVar46 = sVar8 + uVar45;
      if (uVar5 <= sVar8 + uVar45) {
        uVar46 = uVar5;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_c8 = 0;
        uVar39 = 0;
      }
      else {
        if (uVar45 == 0) {
          uVar39 = 0;
LAB_0030cecf:
          uVar25 = 0;
        }
        else {
          uVar39 = (ulong)ringbuffer[uVar45 - 1 & ringbuffer_mask];
          if (uVar45 == 1) goto LAB_0030cecf;
          uVar25 = (ulong)ringbuffer[uVar45 - 2 & ringbuffer_mask];
        }
        local_c8 = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar25 + 0x100] | literal_context_lut[uVar39]];
      }
      local_140 = uVar1 - uVar45;
      pBVar12 = (params->dictionary).contextual.dict[local_c8];
      uVar25 = (params->dist).max_distance;
      uVar51 = uVar45 & ringbuffer_mask;
      uVar37 = (ulong)(hasher->privat)._H5.num_last_distances_to_check_;
      if (uVar37 != 0) {
        puVar50 = ringbuffer + uVar51;
        local_120 = 0x7e4;
        uVar40 = 0;
        uVar55 = 0;
        local_178 = 0;
        uVar41 = 0;
LAB_0030cf63:
        uVar26 = (ulong)dist_cache[uVar55];
        if (((uVar26 <= uVar52) && (uVar45 - uVar26 < uVar45)) &&
           (uVar40 + uVar51 <= ringbuffer_mask)) {
          uVar31 = uVar45 - uVar26 & ringbuffer_mask;
          uVar49 = uVar31 + uVar40;
          if ((ringbuffer_mask < uVar49) || (ringbuffer[uVar40 + uVar51] != ringbuffer[uVar49]))
          goto LAB_0030d033;
          puVar32 = ringbuffer + uVar31;
          puVar44 = puVar50;
          uVar49 = local_140;
          puVar54 = puVar32;
          if (7 < local_140) {
            lVar43 = 0;
LAB_0030cfd9:
            if (*(ulong *)(puVar50 + lVar43) == *(ulong *)(puVar32 + lVar43)) goto code_r0x0030cfe6;
            uVar31 = *(ulong *)(puVar32 + lVar43) ^ *(ulong *)(puVar50 + lVar43);
            uVar49 = 0;
            if (uVar31 != 0) {
              for (; (uVar31 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            uVar49 = (uVar49 >> 3 & 0x1fffffff) + lVar43;
            goto LAB_0030d082;
          }
          goto LAB_0030d000;
        }
        goto LAB_0030d033;
      }
      local_120 = 0x7e4;
      uVar41 = 0;
      local_178 = 0;
      uVar40 = 0;
LAB_0030d105:
      uVar42 = (uint)(*(int *)(ringbuffer + uVar51) * 0x1e35a7bd) >>
               (*(byte *)((long)&hasher->privat + 0x10) & 0x1f);
      uVar20 = uVar42 << (*(byte *)((long)&hasher->privat + 0x18) & 0x1f);
      puVar2 = (ulong *)(ringbuffer + uVar51);
      uVar6 = puVar10[uVar42];
      uVar26 = (ulong)uVar6;
      uVar37 = (hasher->privat)._H5.block_size_;
      uVar55 = 0;
      if (uVar37 <= uVar26) {
        uVar55 = uVar26 - uVar37;
      }
      uVar36 = (hasher->privat)._H5.block_mask_;
      if (uVar55 < uVar26) {
LAB_0030d173:
        uVar26 = uVar26 - 1;
        uVar49 = uVar45 - puVar11[(ulong)uVar20 + (ulong)((uint)uVar26 & uVar36)];
        if (uVar49 <= uVar52) {
          if (uVar40 + uVar51 <= ringbuffer_mask) {
            uVar38 = (ulong)(puVar11[(ulong)uVar20 + (ulong)((uint)uVar26 & uVar36)] &
                            (uint)ringbuffer_mask);
            uVar31 = uVar38 + uVar40;
            if ((ringbuffer_mask < uVar31) || (ringbuffer[uVar40 + uVar51] != ringbuffer[uVar31]))
            goto LAB_0030d285;
            puVar54 = ringbuffer + uVar38;
            uVar31 = local_140;
            puVar47 = puVar2;
            puVar50 = puVar54;
            if (7 < local_140) {
              lVar43 = 0;
LAB_0030d1e0:
              if (*(ulong *)((long)puVar2 + lVar43) == *(ulong *)(puVar54 + lVar43))
              goto code_r0x0030d1f2;
              uVar38 = *(ulong *)(puVar54 + lVar43) ^ *(ulong *)((long)puVar2 + lVar43);
              uVar31 = 0;
              if (uVar38 != 0) {
                for (; (uVar38 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = (uVar31 >> 3 & 0x1fffffff) + lVar43;
              goto LAB_0030d24d;
            }
            goto LAB_0030d209;
          }
          goto LAB_0030d285;
        }
      }
LAB_0030d29a:
      puVar11[(ulong)uVar20 + (ulong)(uVar36 & uVar6)] = (uint32_t)uVar45;
      puVar10[uVar42] = uVar6 + 1;
      if (local_120 == 0x7e4) {
        pHVar13 = (hasher->privat)._H5.common_;
        uVar52 = pHVar13->dict_num_lookups;
        local_100 = pHVar13->dict_num_matches;
        if (uVar52 >> 7 <= local_100) {
          uVar51 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
          puVar50 = pBVar12->hash_table_lengths;
          local_120 = 0x7e4;
          local_114 = 0;
          bVar53 = true;
LAB_0030d332:
          uVar52 = uVar52 + 1;
          pHVar13->dict_num_lookups = uVar52;
          bVar28 = puVar50[uVar51];
          uVar40 = (ulong)bVar28;
          if ((uVar40 != 0) && (uVar40 <= local_140)) {
            pBVar14 = pBVar12->words;
            puVar34 = (ulong *)(pBVar14->data +
                               (ulong)pBVar14->offsets_by_length[uVar40] +
                               pBVar12->hash_table_words[uVar51] * uVar40);
            puVar47 = puVar2;
            uVar55 = uVar40;
            if (7 < bVar28) {
              lVar43 = 0;
LAB_0030d390:
              if (*puVar34 == *puVar47) goto code_r0x0030d39c;
              uVar26 = *puVar47 ^ *puVar34;
              uVar55 = 0;
              if (uVar26 != 0) {
                for (; (uVar26 >> uVar55 & 1) == 0; uVar55 = uVar55 + 1) {
                }
              }
              uVar55 = (uVar55 >> 3 & 0x1fffffff) - lVar43;
              goto LAB_0030d3ff;
            }
            goto LAB_0030d3c5;
          }
          goto LAB_0030d464;
        }
LAB_0030dbe2:
        local_d0 = local_d0 + 1;
        position = uVar45 + 1;
        if (local_138 < position) {
          if ((uint)((int)lVar30 * 4) + local_138 < position) {
            uVar52 = uVar45 + 0x11;
            if (uVar1 - 4 <= uVar45 + 0x11) {
              uVar52 = uVar1 - 4;
            }
            if (position < uVar52) {
              uVar21 = (hasher->privat)._H35.hb.state;
              uVar20 = (hasher->privat)._H5.block_mask_;
              uVar7 = (hasher->privat)._H6.block_mask_;
              do {
                uVar42 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                         ((byte)uVar21 & 0x1f);
                uVar6 = puVar10[uVar42];
                puVar11[(ulong)(uVar20 & uVar6) + (ulong)(uVar42 << ((byte)uVar7 & 0x1f))] =
                     (uint32_t)position;
                puVar10[uVar42] = uVar6 + 1;
                local_d0 = local_d0 + 4;
                position = position + 4;
              } while (position < uVar52);
            }
          }
          else {
            uVar52 = uVar45 + 9;
            if (uVar4 <= uVar45 + 9) {
              uVar52 = uVar4;
            }
            if (position < uVar52) {
              uVar21 = (hasher->privat)._H35.hb.state;
              uVar20 = (hasher->privat)._H5.block_mask_;
              uVar7 = (hasher->privat)._H6.block_mask_;
              do {
                uVar42 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                         ((byte)uVar21 & 0x1f);
                uVar6 = puVar10[uVar42];
                puVar11[(ulong)(uVar20 & uVar6) + (ulong)(uVar42 << ((byte)uVar7 & 0x1f))] =
                     (uint32_t)position;
                puVar10[uVar42] = uVar6 + 1;
                local_d0 = local_d0 + 2;
                position = position + 2;
              } while (position < uVar52);
            }
          }
        }
      }
      else {
        local_114 = 0;
LAB_0030d4df:
        if (local_120 < 0x7e5) goto LAB_0030dbe2;
        iVar23 = (hasher->privat)._H5.num_last_distances_to_check_;
        uVar21 = (hasher->privat)._H35.hb.state;
        uVar20 = (hasher->privat)._H5.block_mask_;
        uVar7 = (hasher->privat)._H6.block_mask_;
        uVar52 = local_d0 + 4;
        local_c4 = 0;
        do {
          local_140 = local_140 - 1;
          uVar46 = local_178 - 1;
          if (local_140 <= local_178 - 1) {
            uVar46 = local_140;
          }
          if (4 < params->quality) {
            uVar46 = 0;
          }
          uVar51 = uVar45 + 1;
          uVar40 = uVar5;
          if (uVar51 < uVar5) {
            uVar40 = uVar51;
          }
          local_b0 = sVar8 + uVar45 + 1;
          if (uVar5 <= local_b0) {
            local_b0 = uVar5;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_c8 = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[uVar39 + 0x100] |
                              literal_context_lut[ringbuffer[uVar45 & ringbuffer_mask]]];
            uVar39 = (ulong)ringbuffer[uVar45 & ringbuffer_mask];
          }
          uVar55 = uVar51 & ringbuffer_mask;
          pBVar12 = (params->dictionary).contextual.dict[local_c8];
          if (iVar23 != 0) {
            puVar50 = ringbuffer + uVar55;
            local_148 = 0x7e4;
            uVar49 = 0;
            local_168 = 0;
            uVar26 = 0;
LAB_0030d627:
            uVar31 = (ulong)dist_cache[uVar49];
            if (((uVar31 <= uVar40) && (uVar51 - uVar31 < uVar51)) &&
               (uVar46 + uVar55 <= ringbuffer_mask)) {
              uVar33 = uVar51 - uVar31 & ringbuffer_mask;
              uVar38 = uVar33 + uVar46;
              if ((ringbuffer_mask < uVar38) || (ringbuffer[uVar46 + uVar55] != ringbuffer[uVar38]))
              goto LAB_0030d757;
              puVar32 = ringbuffer + uVar33;
              puVar44 = puVar50;
              uVar38 = local_140;
              puVar54 = puVar32;
              if (7 < local_140) {
                lVar43 = 0;
LAB_0030d68f:
                if (*(ulong *)(puVar50 + lVar43) == *(ulong *)(puVar32 + lVar43))
                goto code_r0x0030d69c;
                uVar33 = *(ulong *)(puVar32 + lVar43) ^ *(ulong *)(puVar50 + lVar43);
                uVar38 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                uVar38 = (uVar38 >> 3 & 0x1fffffff) + lVar43;
                goto LAB_0030d6f6;
              }
              goto LAB_0030d6b1;
            }
            goto LAB_0030d757;
          }
          local_148 = 0x7e4;
          uVar26 = 0;
          local_168 = 0;
LAB_0030d782:
          puVar2 = (ulong *)(ringbuffer + uVar55);
          uVar36 = (uint)(*(int *)(ringbuffer + uVar55) * 0x1e35a7bd) >> ((byte)uVar21 & 0x1f);
          uVar42 = uVar36 << ((byte)uVar7 & 0x1f);
          uVar6 = puVar10[uVar36];
          uVar31 = (ulong)uVar6;
          uVar49 = 0;
          if (uVar37 <= uVar31) {
            uVar49 = uVar31 - uVar37;
          }
          if (uVar49 < uVar31) {
LAB_0030d7de:
            uVar31 = uVar31 - 1;
            uVar38 = uVar51 - puVar11[(ulong)uVar42 + (ulong)((uint)uVar31 & uVar20)];
            if (uVar38 <= uVar40) {
              if (uVar46 + uVar55 <= ringbuffer_mask) {
                uVar27 = (ulong)(puVar11[(ulong)uVar42 + (ulong)((uint)uVar31 & uVar20)] &
                                (uint)ringbuffer_mask);
                uVar33 = uVar27 + uVar46;
                if ((ringbuffer_mask < uVar33) ||
                   (ringbuffer[uVar46 + uVar55] != ringbuffer[uVar33])) goto LAB_0030d8f1;
                puVar54 = ringbuffer + uVar27;
                uVar33 = local_140;
                puVar50 = puVar54;
                puVar47 = puVar2;
                if (7 < local_140) {
                  lVar43 = 0;
LAB_0030d84c:
                  if (*(ulong *)((long)puVar2 + lVar43) == *(ulong *)(puVar54 + lVar43))
                  goto code_r0x0030d85e;
                  uVar27 = *(ulong *)(puVar54 + lVar43) ^ *(ulong *)((long)puVar2 + lVar43);
                  uVar33 = 0;
                  if (uVar27 != 0) {
                    for (; (uVar27 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                    }
                  }
                  uVar33 = (uVar33 >> 3 & 0x1fffffff) + lVar43;
                  goto LAB_0030d8b9;
                }
                goto LAB_0030d875;
              }
              goto LAB_0030d8f1;
            }
          }
LAB_0030d8fa:
          puVar11[(ulong)uVar42 + (ulong)(uVar20 & uVar6)] = (uint32_t)uVar51;
          puVar10[uVar36] = uVar6 + 1;
          iVar48 = 0;
          if (local_148 == 0x7e4) {
            pHVar13 = (hasher->privat)._H5.common_;
            uVar46 = pHVar13->dict_num_lookups;
            local_70 = pHVar13->dict_num_matches;
            local_148 = 0x7e4;
            if (uVar46 >> 7 <= local_70) {
              uVar40 = (ulong)((uint)((int)*puVar2 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              puVar50 = pBVar12->hash_table_lengths;
              iVar48 = 0;
              local_148 = 0x7e4;
              bVar53 = true;
LAB_0030d9b4:
              uVar46 = uVar46 + 1;
              pHVar13->dict_num_lookups = uVar46;
              bVar28 = puVar50[uVar40];
              uVar55 = (ulong)bVar28;
              if ((uVar55 != 0) && (uVar55 <= local_140)) {
                pBVar14 = pBVar12->words;
                puVar34 = (ulong *)(pBVar14->data +
                                   (ulong)pBVar14->offsets_by_length[uVar55] +
                                   pBVar12->hash_table_words[uVar40] * uVar55);
                puVar47 = puVar2;
                uVar49 = uVar55;
                if (7 < bVar28) {
                  lVar43 = 0;
LAB_0030da0b:
                  if (*puVar34 == *puVar47) goto code_r0x0030da16;
                  uVar31 = *puVar47 ^ *puVar34;
                  uVar49 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                    }
                  }
                  uVar49 = (uVar49 >> 3 & 0x1fffffff) - lVar43;
                  goto LAB_0030da78;
                }
                goto LAB_0030da3f;
              }
              goto LAB_0030db53;
            }
          }
LAB_0030db71:
          if (local_148 < local_120 + 0xaf) {
            local_168 = local_178;
            uVar26 = uVar41;
            uVar51 = uVar45;
            iVar48 = local_114;
            sVar19 = local_d0;
            local_b0 = uVar45 + sVar8;
            if (uVar5 <= uVar45 + sVar8) {
              local_b0 = uVar5;
            }
            break;
          }
          sVar19 = uVar52;
          if (local_c4 == 3) break;
          local_d0 = local_d0 + 1;
          local_c4 = local_c4 + 1;
          uVar46 = uVar45 + 5;
          local_178 = local_168;
          local_120 = local_148;
          uVar45 = uVar51;
          uVar41 = uVar26;
          local_114 = iVar48;
          sVar19 = local_d0;
        } while (uVar46 < uVar1);
        local_d0 = sVar19;
        local_b0 = local_b0 + sVar9;
        if (local_b0 < uVar26) {
LAB_0030ddbb:
          uVar45 = uVar26 + 0xf;
LAB_0030ddbf:
          if ((uVar26 <= local_b0) && (uVar45 != 0)) {
            dist_cache[3] = dist_cache[2];
            uVar15 = *(undefined8 *)dist_cache;
            *(undefined8 *)(dist_cache + 1) = uVar15;
            iVar23 = (int)uVar26;
            *dist_cache = iVar23;
            uVar20 = *(uint *)((long)&(hasher->privat)._H35.hb.table + 4);
            if (4 < (int)uVar20) {
              dist_cache[4] = iVar23 + -1;
              dist_cache[5] = iVar23 + 1;
              dist_cache[6] = iVar23 + -2;
              dist_cache[7] = iVar23 + 2;
              dist_cache[8] = iVar23 + -3;
              dist_cache[9] = iVar23 + 3;
              if (10 < uVar20) {
                iVar23 = (int)uVar15;
                dist_cache[10] = iVar23 + -1;
                dist_cache[0xb] = iVar23 + 1;
                dist_cache[0xc] = iVar23 + -2;
                dist_cache[0xd] = iVar23 + 2;
                *(ulong *)(dist_cache + 0xe) = CONCAT44(iVar23 + 3,iVar23 + -3);
              }
            }
          }
        }
        else {
          if (uVar26 != (long)*dist_cache) {
            uVar45 = 1;
            if (uVar26 != (long)dist_cache[1]) {
              uVar45 = (uVar26 + 3) - (long)*dist_cache;
              if (uVar45 < 7) {
                bVar28 = (byte)((int)uVar45 << 2);
                uVar20 = 0x9750468;
              }
              else {
                uVar45 = (uVar26 + 3) - (long)dist_cache[1];
                if (6 < uVar45) {
                  uVar45 = 2;
                  if ((uVar26 != (long)dist_cache[2]) && (uVar45 = 3, uVar26 != (long)dist_cache[3])
                     ) goto LAB_0030ddbb;
                  goto LAB_0030ddbf;
                }
                bVar28 = (byte)((int)uVar45 << 2);
                uVar20 = 0xfdb1ace;
              }
              uVar45 = (ulong)(uVar20 >> (bVar28 & 0x1f) & 0xf);
            }
            goto LAB_0030ddbf;
          }
          uVar45 = 0;
        }
        uVar20 = (uint)local_d0;
        local_e8->insert_len_ = uVar20;
        local_e8->copy_len_ = iVar48 << 0x19 | (uint)local_168;
        uVar46 = (ulong)(params->dist).num_direct_distance_codes;
        uVar52 = uVar46 + 0x10;
        uVar21 = 0;
        if (uVar52 <= uVar45) {
          uVar42 = (params->dist).distance_postfix_bits;
          bVar28 = (byte)uVar42;
          uVar46 = ((4L << (bVar28 & 0x3f)) + (uVar45 - uVar46)) - 0x10;
          uVar36 = 0x1f;
          uVar22 = (uint)uVar46;
          if (uVar22 != 0) {
            for (; uVar22 >> uVar36 == 0; uVar36 = uVar36 - 1) {
            }
          }
          uVar36 = (uVar36 ^ 0xffffffe0) + 0x1f;
          uVar39 = (ulong)((uVar46 >> ((ulong)uVar36 & 0x3f) & 1) != 0);
          lVar43 = (ulong)uVar36 - (ulong)uVar42;
          uVar45 = (~(-1 << (bVar28 & 0x1f)) & uVar22) + uVar52 +
                   (uVar39 + lVar43 * 2 + 0xfffe << (bVar28 & 0x3f)) | lVar43 * 0x400;
          uVar21 = (uint32_t)(uVar46 - (uVar39 + 2 << ((byte)uVar36 & 0x3f)) >> (bVar28 & 0x3f));
        }
        local_e8->dist_prefix_ = (uint16_t)uVar45;
        local_e8->dist_extra_ = uVar21;
        if (5 < local_d0) {
          if (local_d0 < 0x82) {
            uVar20 = 0x1f;
            uVar42 = (uint)(local_d0 - 2);
            if (uVar42 != 0) {
              for (; uVar42 >> uVar20 == 0; uVar20 = uVar20 - 1) {
              }
            }
            uVar20 = (int)(local_d0 - 2 >> ((char)(uVar20 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar20 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_d0 < 0x842) {
            uVar42 = 0x1f;
            if (uVar20 - 0x42 != 0) {
              for (; uVar20 - 0x42 >> uVar42 == 0; uVar42 = uVar42 - 1) {
              }
            }
            uVar20 = (uVar42 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar20 = 0x15;
            if (0x1841 < local_d0) {
              uVar20 = (uint)(ushort)(0x17 - (local_d0 < 0x5842));
            }
          }
        }
        uVar42 = iVar48 + (uint)local_168;
        if (uVar42 < 10) {
          uVar36 = uVar42 - 2;
        }
        else if (uVar42 < 0x86) {
          uVar42 = uVar42 - 6;
          uVar36 = 0x1f;
          if (uVar42 != 0) {
            for (; uVar42 >> uVar36 == 0; uVar36 = uVar36 - 1) {
            }
          }
          uVar36 = (uVar42 >> ((char)(uVar36 ^ 0xffffffe0) + 0x1fU & 0x1f)) +
                   (uVar36 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar36 = 0x17;
          if (uVar42 < 0x846) {
            uVar36 = 0x1f;
            if (uVar42 - 0x46 != 0) {
              for (; uVar42 - 0x46 >> uVar36 == 0; uVar36 = uVar36 - 1) {
              }
            }
            uVar36 = (uVar36 ^ 0xffe0) + 0x2c;
          }
        }
        uVar6 = (ushort)uVar36;
        uVar35 = (uVar6 & 7) + ((ushort)uVar20 & 7) * 8;
        if ((((uVar45 & 0x3ff) == 0) && ((ushort)uVar20 < 8)) && (uVar6 < 0x10)) {
          if (7 < uVar6) {
            uVar35 = uVar35 + 0x40;
          }
        }
        else {
          iVar23 = ((uVar20 & 0xffff) >> 3) * 3 + ((uVar36 & 0xffff) >> 3);
          uVar35 = uVar35 + ((ushort)(0x520d40 >> ((char)iVar23 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar23 * 0x40 + 0x40;
        }
        local_e8->cmd_prefix_ = uVar35;
        *num_literals = *num_literals + local_d0;
        position = local_168 + uVar51;
        uVar45 = sVar29;
        if (position < sVar29) {
          uVar45 = position;
        }
        uVar52 = uVar51 + 2;
        if (uVar26 < local_168 >> 2) {
          uVar46 = position + uVar26 * -4;
          if (uVar46 < uVar52) {
            uVar46 = uVar52;
          }
          uVar52 = uVar46;
          if (uVar45 < uVar46) {
            uVar52 = uVar45;
          }
        }
        local_138 = uVar51 + lVar30 + local_168 * 2;
        local_e8 = local_e8 + 1;
        if (uVar52 < uVar45) {
          uVar21 = (hasher->privat)._H35.hb.state;
          uVar20 = (hasher->privat)._H5.block_mask_;
          uVar7 = (hasher->privat)._H6.block_mask_;
          do {
            uVar42 = (uint)(*(int *)(ringbuffer + (uVar52 & ringbuffer_mask)) * 0x1e35a7bd) >>
                     ((byte)uVar21 & 0x1f);
            uVar6 = puVar10[uVar42];
            puVar11[(ulong)(uVar20 & uVar6) + (ulong)(uVar42 << ((byte)uVar7 & 0x1f))] =
                 (uint32_t)uVar52;
            puVar10[uVar42] = uVar6 + 1;
            uVar52 = uVar52 + 1;
          } while (uVar45 != uVar52);
        }
        local_d0 = 0;
      }
      uVar45 = position;
    } while (position + 4 < uVar1);
  }
  else {
    local_e8 = commands;
  }
  *last_insert_len = (local_d0 + uVar1) - position;
  *num_commands = *num_commands + ((long)local_e8 - (long)commands >> 4);
  return;
code_r0x0030cfe6:
  uVar49 = uVar49 - 8;
  lVar43 = lVar43 + 8;
  if (uVar49 < 8) goto code_r0x0030cff4;
  goto LAB_0030cfd9;
code_r0x0030cff4:
  puVar54 = puVar32 + lVar43;
  puVar44 = puVar50 + lVar43;
LAB_0030d000:
  if (uVar49 != 0) {
    uVar31 = 0;
    do {
      uVar38 = uVar31;
      if (puVar54[uVar31] != puVar44[uVar31]) break;
      uVar31 = uVar31 + 1;
      uVar38 = uVar49;
    } while (uVar49 != uVar31);
    puVar54 = puVar54 + uVar38;
  }
  uVar49 = (long)puVar54 - (long)puVar32;
LAB_0030d082:
  if (((2 < uVar49) || ((uVar55 < 2 && (uVar49 == 2)))) &&
     (uVar31 = uVar49 * 0x87 + 0x78f, local_120 < uVar31)) {
    if (uVar55 != 0) {
      uVar31 = uVar31 - ((0x1ca10U >> ((byte)uVar55 & 0xe) & 0xe) + 0x27);
    }
    if (local_120 < uVar31) {
      uVar41 = uVar26;
      uVar40 = uVar49;
      local_178 = uVar49;
      local_120 = uVar31;
    }
  }
LAB_0030d033:
  uVar55 = uVar55 + 1;
  if (uVar55 == uVar37) goto LAB_0030d105;
  goto LAB_0030cf63;
code_r0x0030d1f2:
  uVar31 = uVar31 - 8;
  lVar43 = lVar43 + 8;
  if (uVar31 < 8) goto code_r0x0030d200;
  goto LAB_0030d1e0;
code_r0x0030d200:
  puVar50 = puVar54 + lVar43;
  puVar47 = (ulong *)(lVar43 + (long)puVar2);
LAB_0030d209:
  if (uVar31 != 0) {
    uVar38 = 0;
    do {
      uVar33 = uVar38;
      if (puVar50[uVar38] != *(uint8_t *)((long)puVar47 + uVar38)) break;
      uVar38 = uVar38 + 1;
      uVar33 = uVar31;
    } while (uVar31 != uVar38);
    puVar50 = puVar50 + uVar33;
  }
  uVar31 = (long)puVar50 - (long)puVar54;
LAB_0030d24d:
  if (3 < uVar31) {
    iVar23 = 0x1f;
    if ((uint)uVar49 != 0) {
      for (; (uint)uVar49 >> iVar23 == 0; iVar23 = iVar23 + -1) {
      }
    }
    uVar38 = (ulong)(iVar23 * -0x1e + 0x780) + uVar31 * 0x87;
    if (local_120 < uVar38) {
      uVar41 = uVar49;
      uVar40 = uVar31;
      local_178 = uVar31;
      local_120 = uVar38;
    }
  }
LAB_0030d285:
  if (uVar26 <= uVar55) goto LAB_0030d29a;
  goto LAB_0030d173;
code_r0x0030d39c:
  puVar34 = puVar34 + 1;
  puVar47 = puVar47 + 1;
  lVar3 = lVar43 + uVar40;
  lVar43 = lVar43 + -8;
  if (lVar3 - 8U < 8) goto code_r0x0030d3b6;
  goto LAB_0030d390;
code_r0x0030d3b6:
  uVar55 = lVar43 + uVar40;
  if (lVar43 + uVar40 != 0) {
LAB_0030d3c5:
    uVar26 = 0;
    do {
      uVar49 = uVar26;
      if (*(char *)((long)puVar47 + uVar26) != *(char *)((long)puVar34 + uVar26)) break;
      uVar26 = uVar26 + 1;
      uVar49 = uVar55;
    } while (uVar55 != uVar26);
    puVar47 = (ulong *)(uVar49 + (long)puVar47);
  }
  uVar55 = (long)puVar47 - (long)puVar2;
LAB_0030d3ff:
  if (((uVar55 != 0) && (uVar40 < pBVar12->cutoffTransformsCount + uVar55)) &&
     (uVar40 = (ulong)pBVar12->hash_table_words[uVar51] + uVar46 + lVar24 +
               ((ulong)((uint)(pBVar12->cutoffTransforms >>
                              ((char)(uVar40 - uVar55) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar40 - uVar55) * 4 << (pBVar14->size_bits_by_length[uVar40] & 0x3f)),
     uVar40 <= uVar25)) {
    iVar23 = 0x1f;
    if ((uint)uVar40 != 0) {
      for (; (uint)uVar40 >> iVar23 == 0; iVar23 = iVar23 + -1) {
      }
    }
    uVar26 = (uVar55 * 0x87 - (ulong)(uint)(iVar23 * 0x1e)) + 0x780;
    if (local_120 <= uVar26) {
      local_114 = (uint)bVar28 - (int)uVar55;
      local_100 = local_100 + 1;
      pHVar13->dict_num_matches = local_100;
      local_178 = uVar55;
      local_120 = uVar26;
      uVar41 = uVar40;
    }
  }
LAB_0030d464:
  uVar51 = uVar51 + 1;
  bVar17 = !bVar53;
  bVar53 = false;
  if (bVar17) goto LAB_0030d4df;
  goto LAB_0030d332;
code_r0x0030d69c:
  uVar38 = uVar38 - 8;
  lVar43 = lVar43 + 8;
  if (uVar38 < 8) goto code_r0x0030d6aa;
  goto LAB_0030d68f;
code_r0x0030d6aa:
  puVar54 = puVar32 + lVar43;
  puVar44 = puVar50 + lVar43;
LAB_0030d6b1:
  if (uVar38 != 0) {
    uVar33 = 0;
    do {
      uVar27 = uVar33;
      if (puVar54[uVar33] != puVar44[uVar33]) break;
      uVar33 = uVar33 + 1;
      uVar27 = uVar38;
    } while (uVar38 != uVar33);
    puVar54 = puVar54 + uVar27;
  }
  uVar38 = (long)puVar54 - (long)puVar32;
LAB_0030d6f6:
  if (((2 < uVar38) || ((uVar49 < 2 && (uVar38 == 2)))) &&
     (uVar33 = uVar38 * 0x87 + 0x78f, local_148 < uVar33)) {
    if (uVar49 != 0) {
      uVar33 = uVar33 - ((0x1ca10U >> ((byte)uVar49 & 0xe) & 0xe) + 0x27);
    }
    if (local_148 < uVar33) {
      uVar46 = uVar38;
      uVar26 = uVar31;
      local_168 = uVar38;
      local_148 = uVar33;
    }
  }
LAB_0030d757:
  uVar49 = uVar49 + 1;
  if (uVar49 == (long)iVar23) goto LAB_0030d782;
  goto LAB_0030d627;
code_r0x0030d85e:
  uVar33 = uVar33 - 8;
  lVar43 = lVar43 + 8;
  if (uVar33 < 8) goto code_r0x0030d86c;
  goto LAB_0030d84c;
code_r0x0030d86c:
  puVar50 = puVar54 + lVar43;
  puVar47 = (ulong *)(lVar43 + (long)puVar2);
LAB_0030d875:
  if (uVar33 != 0) {
    uVar27 = 0;
    do {
      uVar18 = uVar27;
      if (puVar50[uVar27] != *(uint8_t *)((long)puVar47 + uVar27)) break;
      uVar27 = uVar27 + 1;
      uVar18 = uVar33;
    } while (uVar33 != uVar27);
    puVar50 = puVar50 + uVar18;
  }
  uVar33 = (long)puVar50 - (long)puVar54;
LAB_0030d8b9:
  if (3 < uVar33) {
    iVar48 = 0x1f;
    if ((uint)uVar38 != 0) {
      for (; (uint)uVar38 >> iVar48 == 0; iVar48 = iVar48 + -1) {
      }
    }
    uVar27 = (ulong)(iVar48 * -0x1e + 0x780) + uVar33 * 0x87;
    if (local_148 < uVar27) {
      uVar46 = uVar33;
      uVar26 = uVar38;
      local_168 = uVar33;
      local_148 = uVar27;
    }
  }
LAB_0030d8f1:
  if (uVar31 <= uVar49) goto LAB_0030d8fa;
  goto LAB_0030d7de;
code_r0x0030da16:
  puVar34 = puVar34 + 1;
  puVar47 = puVar47 + 1;
  lVar3 = uVar55 + lVar43;
  lVar43 = lVar43 + -8;
  if (lVar3 - 8U < 8) goto code_r0x0030da30;
  goto LAB_0030da0b;
code_r0x0030da30:
  uVar49 = lVar43 + uVar55;
  if (lVar43 + uVar55 != 0) {
LAB_0030da3f:
    uVar31 = 0;
    do {
      uVar38 = uVar31;
      if (*(char *)((long)puVar47 + uVar31) != *(char *)((long)puVar34 + uVar31)) break;
      uVar31 = uVar31 + 1;
      uVar38 = uVar49;
    } while (uVar49 != uVar31);
    puVar47 = (ulong *)((long)puVar47 + uVar38);
  }
  uVar49 = (long)puVar47 - (long)puVar2;
LAB_0030da78:
  if (((uVar49 != 0) && (uVar55 < pBVar12->cutoffTransformsCount + uVar49)) &&
     (uVar55 = (ulong)pBVar12->hash_table_words[uVar40] + lVar24 + local_b0 +
               ((ulong)((uint)(pBVar12->cutoffTransforms >>
                              ((char)(uVar55 - uVar49) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar55 - uVar49) * 4 << (pBVar14->size_bits_by_length[uVar55] & 0x3f)),
     uVar55 <= uVar25)) {
    iVar16 = 0x1f;
    if ((uint)uVar55 != 0) {
      for (; (uint)uVar55 >> iVar16 == 0; iVar16 = iVar16 + -1) {
      }
    }
    uVar31 = (uVar49 * 0x87 - (ulong)(uint)(iVar16 * 0x1e)) + 0x780;
    if (local_148 <= uVar31) {
      iVar48 = (uint)bVar28 - (int)uVar49;
      local_70 = local_70 + 1;
      pHVar13->dict_num_matches = local_70;
      local_168 = uVar49;
      uVar26 = uVar55;
      local_148 = uVar31;
    }
  }
LAB_0030db53:
  uVar40 = uVar40 + 1;
  bVar17 = !bVar53;
  bVar53 = false;
  if (bVar17) goto LAB_0030db71;
  goto LAB_0030d9b4;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}